

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_chunk_create(uchar **out,size_t *outlength,uint length,char *type,uchar *data)

{
  uchar *chunk_00;
  void *pvVar1;
  uchar *buffer;
  uchar *in_RCX;
  uint in_EDX;
  ulong *in_RSI;
  long *in_RDI;
  long in_R8;
  size_t new_length;
  uchar *new_buffer;
  uchar *chunk;
  uint i;
  size_t in_stack_ffffffffffffffa8;
  uint local_34;
  uint local_4;
  
  chunk_00 = (uchar *)(*in_RSI + (ulong)in_EDX + 0xc);
  if ((chunk_00 < (uchar *)(ulong)(in_EDX + 0xc)) || (chunk_00 < (uchar *)*in_RSI)) {
    local_4 = 0x4d;
  }
  else {
    pvVar1 = lodepng_realloc(chunk_00,in_stack_ffffffffffffffa8);
    if (pvVar1 == (void *)0x0) {
      local_4 = 0x53;
    }
    else {
      *in_RDI = (long)pvVar1;
      *in_RSI = (ulong)chunk_00;
      buffer = (uchar *)(*in_RDI + (*in_RSI - (ulong)in_EDX) + -0xc);
      lodepng_set32bitInt(buffer,in_EDX);
      buffer[4] = *in_RCX;
      buffer[5] = in_RCX[1];
      buffer[6] = in_RCX[2];
      buffer[7] = in_RCX[3];
      for (local_34 = 0; local_34 != in_EDX; local_34 = local_34 + 1) {
        buffer[local_34 + 8] = *(uchar *)(in_R8 + (ulong)local_34);
      }
      lodepng_chunk_generate_crc(chunk_00);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

unsigned lodepng_chunk_create(unsigned char** out, size_t* outlength, unsigned length,
                              const char* type, const unsigned char* data)
{
  unsigned i;
  unsigned char *chunk, *new_buffer;
  size_t new_length = (*outlength) + length + 12;
  if(new_length < length + 12 || new_length < (*outlength)) return 77; /*integer overflow happened*/
  new_buffer = (unsigned char*)lodepng_realloc(*out, new_length);
  if(!new_buffer) return 83; /*alloc fail*/
  (*out) = new_buffer;
  (*outlength) = new_length;
  chunk = &(*out)[(*outlength) - length - 12];

  /*1: length*/
  lodepng_set32bitInt(chunk, (unsigned)length);

  /*2: chunk name (4 letters)*/
  chunk[4] = (unsigned char)type[0];
  chunk[5] = (unsigned char)type[1];
  chunk[6] = (unsigned char)type[2];
  chunk[7] = (unsigned char)type[3];

  /*3: the data*/
  for(i = 0; i != length; ++i) chunk[8 + i] = data[i];

  /*4: CRC (of the chunkname characters and the data)*/
  lodepng_chunk_generate_crc(chunk);

  return 0;
}